

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnsrchmp.c
# Opt level: O2

int cstep(double *stx,double *fx,double *dx,double *sty,double *fy,double *dy,double *stp,double *fp
         ,double *dp,int *brackt,double stpmin,double stpmax)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  if (*brackt == 1) {
    dVar5 = *stp;
    dVar4 = pmin(*stx,*sty);
    if (dVar5 <= dVar4) {
      return 0;
    }
    dVar5 = *stp;
    dVar4 = pmax(*stx,*sty);
    if (dVar4 <= dVar5) {
      return 0;
    }
  }
  if (stpmax < stpmin) {
    return 0;
  }
  dVar5 = *dx;
  dVar4 = *stp;
  dVar9 = dVar4 - *stx;
  if (0.0 <= dVar5 * dVar9) {
    return 0;
  }
  dVar11 = *dp;
  dVar7 = ABS(dVar5);
  dVar10 = (dVar5 / dVar7) * dVar11;
  dVar8 = *fp;
  dVar6 = *fx;
  if (dVar6 < dVar8) {
    dVar11 = dVar11 + dVar5 + ((dVar6 - dVar8) * 3.0) / dVar9;
    dVar5 = pmax(ABS(dVar11),dVar7);
    dVar5 = pmax(dVar5,ABS(*dp));
    dVar9 = (dVar11 / dVar5) * (dVar11 / dVar5) - (*dx / dVar5) * (*dp / dVar5);
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    dVar4 = *stp;
    dVar8 = *stx;
    dVar7 = (double)(~-(ulong)(dVar4 < dVar8) & (ulong)(dVar5 * dVar9) |
                    (ulong)-(dVar5 * dVar9) & -(ulong)(dVar4 < dVar8));
    dVar5 = *dx;
    dVar9 = dVar7 - dVar5;
    dVar6 = dVar4 - dVar8;
    dVar9 = ((dVar11 + dVar9) / (dVar9 + dVar7 + *dp)) * dVar6 + dVar8;
    dVar5 = (dVar5 / ((*fx - *fp) / dVar6 + dVar5)) * 0.5 * dVar6 + dVar8;
    uVar3 = -(ulong)(ABS(dVar9 - dVar8) < ABS(dVar5 - dVar8));
    dVar5 = (double)(~uVar3 & (ulong)((dVar5 - dVar9) * 0.5 + dVar9) | (ulong)dVar9 & uVar3);
    *brackt = 1;
    iVar2 = 1;
    bVar1 = true;
    goto LAB_0013dabf;
  }
  if (dVar10 < 0.0) {
    dVar11 = dVar11 + dVar5 + ((dVar6 - dVar8) * 3.0) / dVar9;
    dVar5 = pmax(ABS(dVar11),dVar7);
    dVar5 = pmax(dVar5,ABS(*dp));
    dVar9 = (dVar11 / dVar5) * (dVar11 / dVar5) - (*dx / dVar5) * (*dp / dVar5);
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    dVar4 = *stp;
    uVar3 = -(ulong)(*stx < dVar4);
    dVar8 = (double)(~uVar3 & (ulong)(dVar5 * dVar9) | (ulong)-(dVar5 * dVar9) & uVar3);
    dVar5 = *dp;
    dVar6 = dVar8 - dVar5;
    dVar9 = *stx - dVar4;
    dVar11 = ((dVar11 + dVar6) / (dVar6 + dVar8 + *dx)) * dVar9 + dVar4;
    dVar5 = (dVar5 / (dVar5 - *dx)) * dVar9 + dVar4;
    uVar3 = -(ulong)(ABS(dVar5 - dVar4) < ABS(dVar11 - dVar4));
    dVar5 = (double)(~uVar3 & (ulong)dVar5 | (ulong)dVar11 & uVar3);
    *brackt = 1;
    iVar2 = 2;
    bVar1 = false;
    goto LAB_0013dabf;
  }
  if (dVar7 <= ABS(dVar11)) {
    if (*brackt == 1) {
      dVar11 = dVar11 + ((dVar8 - *fy) * 3.0) / (*sty - dVar4) + *dy;
      dVar5 = pmax(ABS(dVar11),ABS(*dy));
      dVar5 = pmax(dVar5,ABS(*dp));
      dVar9 = (dVar11 / dVar5) * (dVar11 / dVar5) - (*dy / dVar5) * (*dp / dVar5);
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      dVar4 = *stp;
      uVar3 = -(ulong)(*sty < dVar4);
      dVar5 = (double)(~uVar3 & (ulong)(dVar5 * dVar9) | (ulong)-(dVar5 * dVar9) & uVar3);
      dVar9 = dVar5 - *dp;
      dVar5 = (*sty - dVar4) * ((dVar11 + dVar9) / (dVar9 + dVar5 + *dy)) + dVar4;
      iVar2 = 4;
      bVar1 = false;
    }
    else {
      uVar3 = -(ulong)(*stx < dVar4);
      dVar5 = (double)(~uVar3 & (ulong)stpmin | uVar3 & (ulong)stpmax);
      iVar2 = 4;
      bVar1 = false;
    }
    goto LAB_0013dabf;
  }
  dVar11 = dVar11 + dVar5 + ((dVar6 - dVar8) * 3.0) / dVar9;
  dVar5 = pmax(ABS(dVar11),dVar7);
  dVar5 = pmax(dVar5,ABS(*dp));
  dVar4 = pmax(0.0,(dVar11 / dVar5) * (dVar11 / dVar5) - (*dx / dVar5) * (*dp / dVar5));
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  dVar5 = dVar5 * dVar4;
  dVar4 = *stp;
  dVar9 = *stx;
  dVar6 = -dVar5;
  uVar3 = -(ulong)(dVar9 < dVar4);
  dVar8 = *dp;
  if ((dVar5 != dVar6) || (NAN(dVar5) || NAN(dVar6))) {
    dVar5 = (double)(~uVar3 & (ulong)dVar5 | (ulong)dVar6 & uVar3);
    dVar5 = (dVar11 + (dVar5 - dVar8)) / ((*dx - dVar8) + dVar5 + dVar5);
    if (0.0 <= dVar5) goto LAB_0013dd14;
    dVar5 = dVar5 * (dVar9 - dVar4) + dVar4;
  }
  else {
LAB_0013dd14:
    dVar5 = (double)(~uVar3 & (ulong)stpmin | uVar3 & (ulong)stpmax);
  }
  dVar9 = (dVar8 / (dVar8 - *dx)) * (dVar9 - dVar4) + dVar4;
  if (*brackt == 1) {
    uVar3 = -(ulong)(ABS(dVar4 - dVar5) < ABS(dVar4 - dVar9));
    dVar5 = (double)(~uVar3 & (ulong)dVar9 | (ulong)dVar5 & uVar3);
    iVar2 = 3;
    bVar1 = true;
  }
  else {
    uVar3 = -(ulong)(ABS(dVar4 - dVar9) < ABS(dVar4 - dVar5));
    dVar5 = (double)(~uVar3 & (ulong)dVar9 | (ulong)dVar5 & uVar3);
    iVar2 = 3;
    bVar1 = true;
  }
LAB_0013dabf:
  if (*fp < *fx || *fp == *fx) {
    if (dVar10 < 0.0) {
      *sty = *stx;
      *fy = *fx;
      *dy = *dx;
      dVar4 = *stp;
    }
    *stx = dVar4;
    fy = fx;
    dy = dx;
  }
  else {
    *sty = dVar4;
  }
  *fy = *fp;
  *dy = *dp;
  dVar5 = pmin(stpmax,dVar5);
  dVar5 = pmax(stpmin,dVar5);
  *stp = dVar5;
  if (bVar1 && *brackt == 1) {
    dVar4 = *stx;
    dVar9 = (*sty - dVar4) * 0.66 + dVar4;
    if (*sty <= dVar4) {
      dVar5 = pmax(dVar9,dVar5);
    }
    else {
      dVar5 = pmin(dVar9,dVar5);
    }
    *stp = dVar5;
  }
  return iVar2;
}

Assistant:

int cstep(double *stx,double *fx,double *dx,double *sty,double *fy,double *dy,double *stp,double *fp,double *dp,int *brackt,
                       double  stpmin,double stpmax) {
	int info,bound;
	double gamma, p, p66, q, r, s, sgnd, stpc, stpf, stpq, theta;

	info = 0;
	p66 = 0.66;

	if ((*brackt == 1 && (*stp <= pmin(*stx, *sty) || *stp >= pmax(*stx, *sty))) || *dx*(*stp - *stx) >= 0.0 || stpmax < stpmin) {
		return info;
	}

	sgnd = (*dp) * (*dx / fabs(*dx));

	/*
	 First case. A higher function value. (fp > fx)
     The minimum is bracketed. If the cubic step is closer
	 to stx than the quadratic step, the cubic step is taken,
     else the average of the cubic and quadratic steps is taken.
	*/

	if (*fp > *fx) {
		info = 1;
		bound = 1;
		theta = 3 * (*fx - *fp) / (*stp - *stx) + *dx + *dp;
		s = pmax(fabs(theta), fabs(*dx));
		s = pmax(s, fabs(*dp));
		gamma = s*sqrt((theta / s)*(theta/s) - (*dx / s)*(*dp / s));
		if (*stp < *stx) {
			gamma = -gamma;
		}
		p = (gamma - *dx) + theta;
		q = ((gamma - *dx) + gamma) + *dp;
		r = p / q;
		stpc = *stx + r*(*stp - *stx);
		stpq = *stx + ((*dx / ((*fx - *fp) / (*stp - *stx) + *dx)) / 2)*(*stp - *stx);

		if (fabs(stpc - *stx) < fabs(stpq - *stx)) {
			stpf = stpc;
		} else {
			stpf = stpc + (stpq - stpc) / 2;
		}
		*brackt = 1;
	} else if (sgnd < 0.0) {
		/*
		Second case. A lower function value and derivatives of
	    opposite sign. The minimum is bracketed. If the cubic
	    step is closer to stx than the quadratic (secant) step, 
	    the cubic step is taken, else the quadratic step is taken.
		*/

		info = 2;
		bound = 0;
		theta = 3 * (*fx - *fp) / (*stp - *stx) + *dx + *dp;
		s = pmax(fabs(theta), fabs(*dx));
		s = pmax(s, fabs(*dp));
		gamma = s*sqrt((theta / s)*(theta / s) - (*dx / s)*(*dp / s));
		if (*stp > *stx) {
			gamma = -gamma;
		}
		p = (gamma - *dp) + theta;
		q = ((gamma - *dp) + gamma) + *dx;
		r = p / q;
		stpc = *stp + r*(*stx - *stp);
		stpq = *stp + (*dp / (*dp - *dx))*(*stx - *stp);
		if (fabs(stpc - *stp) > fabs(stpq - *stp)) {
			stpf = stpc;
		} else {
			stpf = stpq;
		}
		*brackt = 1;
	}
	else if (fabs(*dp) < fabs(*dx)) {
		/*
     Third case. A lower function value, derivatives of the
     same sign, and the magnitude of the derivative decreases.
     The cubic step is only used if the cubic tends to infinity 
     in the direction of the step or if the minimum of the cubic
     is beyond stp. Otherwise the cubic step is defined to be 
     either stpmin or stpmax. The quadratic (secant) step is also 
     computed and if the minimum is bracketed then the the step 
     closest to stx is taken, else the step farthest away is taken.
		*/

		info = 3;
		bound = 1;
		theta = 3 * (*fx - *fp) / (*stp - *stx) + *dx + *dp;
		s = pmax(fabs(theta), fabs(*dx));
		s = pmax(s, fabs(*dp));

		/*
		 The case gamma = 0 only arises if the cubic does not tend
         to infinity in the direction of the step.
		*/

		gamma = s*sqrt(pmax(0., (theta / s)*(theta / s) - (*dx / s)*(*dp / s)));
		if (*stp > *stx) {
			gamma = -gamma;
		}
		p = (gamma - *dp) + theta;
		q = (gamma + (*dx - *dp)) + gamma;
		r = p / q;

		if (r < 0.0 && gamma != 0.0) {
			stpc = *stp + r*(*stx - *stp);
		} else if (*stp > *stx) {
			stpc = stpmax;
		} else {
			stpc = stpmin;
		}
		stpq = *stp + (*dp / (*dp - *dx))*(*stx - *stp);
		if (*brackt == 1) {
			if (fabs(*stp - stpc) < fabs(*stp - stpq)) {
				stpf = stpc;
			} else {
				stpf = stpq;
			}
		} else {
			if (fabs(*stp - stpc) > fabs(*stp - stpq)) {
				stpf = stpc;
			} else {
				stpf = stpq;
			}
		}
	}
	else {
		/*
     Fourth case. A lower function value, derivatives of the
     same sign, and the magnitude of the derivative does
     not decrease. If the minimum is not bracketed, the step
     is either stpmin or stpmax, else the cubic step is taken.

		*/
		info = 4;
		bound = 0;
		if (*brackt == 1) {
			theta = 3 * (*fp - *fy) / (*sty - *stp) + *dy + *dp;
			s = pmax(fabs(theta), fabs(*dy));
			s = pmax(s,fabs(*dp));
			gamma = s*sqrt((theta / s)*(theta / s) - (*dy / s)*(*dp / s));
			if (*stp > *sty) {
				gamma = -gamma;
			}
			p = (gamma - *dp) + theta;
			q = ((gamma - *dp) + gamma) + *dy;
			r = p / q;
			stpc = *stp + r*(*sty - *stp);
			stpf = stpc;
		}
		else if (*stp > *stx) {
			stpf = stpmax;
		}
		else {
			stpf = stpmin;
		}
		
	}
	/*
	Update the interval of uncertainty. This update does not
    depend on the new step or the case analysis above.
	*/

	if (*fp > *fx) {
		*sty = *stp;
		*fy = *fp;
		*dy = *dp;
	} else { 
		if (sgnd < 0.0) {
			*sty = *stx;
			*fy = *fx;
			*dy = *dx;
		}
		*stx = *stp;
		*fx = *fp;
		*dx = *dp;
	}
	/*
	Compute the new step and safeguard it.
	*/

	stpf = pmin(stpmax, stpf);
	stpf = pmax(stpmin, stpf);
	*stp = stpf;
	if (*brackt == 1 && bound == 1) {
		if (*sty > *stx) {
			*stp = pmin(*stx + p66*(*sty - *stx), *stp);
		} else {
			*stp = pmax(*stx + p66*(*sty - *stx), *stp);
		}
	}


	return info;
}